

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O0

void __thiscall Pl_Base64::finish(Pl_Base64 *this)

{
  logic_error *this_00;
  Pipeline *pPVar1;
  ulong local_28;
  size_t i;
  Pl_Base64 *this_local;
  
  if (this->pos != 0) {
    if ((this->finished & 1U) != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Pl_Base64 used after finished");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (this->action == a_decode) {
      for (local_28 = this->pos; local_28 < 4; local_28 = local_28 + 1) {
        this->buf[local_28] = '=';
      }
    }
    flush(this);
  }
  this->finished = true;
  pPVar1 = Pipeline::next(&this->super_Pipeline);
  (*pPVar1->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_Base64::finish()
{
    if (this->pos > 0) {
        if (finished) {
            throw std::logic_error("Pl_Base64 used after finished");
        }
        if (this->action == a_decode) {
            for (size_t i = this->pos; i < 4; ++i) {
                this->buf[i] = '=';
            }
        }
        flush();
    }
    this->finished = true;
    next()->finish();
}